

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O1

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deInt64 value)

{
  uint uVar1;
  uint uVar2;
  deUint8 adVar3 [8];
  size_t i;
  long lVar4;
  long lVar5;
  uint uVar6;
  deUint8 data [8];
  
  adVar3 = (deUint8  [8])(value ^ 0xaba0480139f77e2);
  data[0] = adVar3[0];
  data[1] = adVar3[1];
  data[2] = adVar3[2];
  data[3] = adVar3[3];
  data[4] = adVar3[4];
  data[5] = adVar3[5];
  data[6] = adVar3[6];
  data[7] = adVar3[7];
  uVar2 = builder->m_hash;
  lVar4 = 0;
  do {
    uVar2 = uVar2 ^ data[lVar4];
    lVar5 = 8;
    do {
      uVar6 = uVar2 >> 1;
      uVar1 = uVar2 & 1;
      uVar2 = uVar6 ^ 0x4c11db7;
      if (uVar1 == 0) {
        uVar2 = uVar6;
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  builder->m_hash = uVar2;
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deInt64 value)
{
	const deInt64	val		= value ^ 772935234179004386ll;
	const deUint8	data[]	=
	{
		(deUint8)(((deUint64)val) & 0xFFu),
		(deUint8)((((deUint64)val) >> 8) & 0xFFu),
		(deUint8)((((deUint64)val) >> 16) & 0xFFu),
		(deUint8)((((deUint64)val) >> 24) & 0xFFu),

		(deUint8)((((deUint64)val) >> 32) & 0xFFu),
		(deUint8)((((deUint64)val) >> 40) & 0xFFu),
		(deUint8)((((deUint64)val) >> 48) & 0xFFu),
		(deUint8)((((deUint64)val) >> 56) & 0xFFu),
	};

	builder.feed(sizeof(data), data);
	return builder;
}